

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsSurfaceGeometry.h
# Opt level: O1

Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> * __thiscall
anurbs::NurbsSurfaceGeometry<3L>::knots_v
          (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
           *__return_storage_ptr__,NurbsSurfaceGeometry<3L> *this)

{
  (__return_storage_ptr__->
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ).
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = (PointerType)0x0;
  (__return_storage_ptr__->
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  ).
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_rows.m_value = 0;
  (__return_storage_ptr__->m_object).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (double *)0x0;
  (__return_storage_ptr__->m_object).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  Eigen::RefBase<Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>>::
  construct<Eigen::Matrix<double,_1,1,0,_1,1>const>
            ((RefBase<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>> *)
             __return_storage_ptr__,&this->m_knots_v);
  return __return_storage_ptr__;
}

Assistant:

Eigen::Ref<const Eigen::VectorXd> knots_v() const
    {
        return m_knots_v;
    }